

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

ON_SubDMeshFragment * __thiscall ON_SubDMeshFragment::FirstFaceFragment(ON_SubDMeshFragment *this)

{
  bool bVar1;
  uint uVar2;
  ON_SubDMeshFragment *this_00;
  
  bVar1 = IsFullFaceFragment(this);
  if (bVar1) {
    return this;
  }
  uVar2 = FaceCornerIndex(this);
  if (uVar2 != 0xffffffff) {
    do {
      this_00 = this;
      if (this->m_face_fragment_index == 0) {
        do {
          this_00 = NextFaceFragment(this_00,false);
          if (this_00 == (ON_SubDMeshFragment *)0x0) {
            return (ON_SubDMeshFragment *)0x0;
          }
        } while (this_00->m_face_fragment_index + 1 < (uint)this_00->m_face_fragment_count);
        return this;
      }
      this = PreviousFaceFragment(this,false);
    } while (this != (ON_SubDMeshFragment *)0x0);
  }
  return (ON_SubDMeshFragment *)0x0;
}

Assistant:

const ON_SubDMeshFragment* ON_SubDMeshFragment::FirstFaceFragment() const
{
  if (IsFullFaceFragment())
    return this;
  if (false == IsFaceCornerFragment())
    return nullptr;

  const ON_SubDMeshFragment* first = this;
  while (nullptr != first && first->m_face_fragment_index > 0)
    first = first->PreviousFaceFragment(false);
  if (nullptr == first)
    return nullptr;
  const ON_SubDMeshFragment* last = first->NextFaceFragment(false);
  while (nullptr != last && last->m_face_fragment_index + 1 < last->m_face_fragment_count)
    last = last->NextFaceFragment(false);
  if (nullptr == last)
    return nullptr;
  return first;
}